

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::initialize_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                   *this,size_t new_capacity)

{
  char *p;
  CopyConst<char,_ElementType<0UL>_> *pCVar1;
  CopyConst<char,_ElementType<1UL>_>_conflict4 *pCVar2;
  Layout layout;
  LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::hash_internal::Enum> local_30;
  
  if (new_capacity != 0) {
    local_30.size_ = (size_t  [2])MakeLayout(new_capacity);
    p = (char *)Allocate<4ul,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
                          ((Alloc<phmap::priv::hash_internal::Enum> *)&this->settings_,
                           (local_30.size_[0] + 3 & 0xfffffffffffffffc) + local_30.size_[1] * 4);
    pCVar1 = internal_layout::
             LayoutImpl<std::tuple<signed_char,phmap::priv::hash_internal::Enum>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<0ul,char>((LayoutImpl<std::tuple<signed_char,phmap::priv::hash_internal::Enum>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&local_30,p);
    this->ctrl_ = pCVar1;
    pCVar2 = internal_layout::
             LayoutImpl<std::tuple<signed_char,phmap::priv::hash_internal::Enum>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<1ul,char>((LayoutImpl<std::tuple<signed_char,phmap::priv::hash_internal::Enum>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&local_30,p);
    this->slots_ = pCVar2;
    memset(this->ctrl_,0x80,new_capacity + 0x10);
    this->ctrl_[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    return;
  }
  __assert_fail("new_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x7dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>::initialize_slots(size_t) [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::Enum>]"
               );
}

Assistant:

void initialize_slots(size_t new_capacity) {
        assert(new_capacity);
        if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value && 
            slots_ == nullptr) {
            infoz_ = Sample();
        }

        auto layout = MakeLayout(new_capacity);
        char* mem = static_cast<char*>(
            Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
        ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
        slots_ = layout.template Pointer<1>(mem);
        reset_ctrl(new_capacity);
        reset_growth_left(new_capacity);
        infoz_.RecordStorageChanged(size_, new_capacity);
    }